

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

void * uv__reallocf(void *ptr,size_t size)

{
  void *pvVar1;
  
  pvVar1 = (void *)(*(code *)uv__allocator_1)();
  if (size != 0 && pvVar1 == (void *)0x0) {
    uv__free(ptr);
  }
  return pvVar1;
}

Assistant:

void* uv__reallocf(void* ptr, size_t size) {
  void* newptr;

  newptr = uv__realloc(ptr, size);
  if (newptr == NULL)
    if (size > 0)
      uv__free(ptr);

  return newptr;
}